

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

void prsgfn(prscxdef *ctx,prsndef *n,int cnt)

{
  ushort *puVar1;
  ushort uVar2;
  emtcxdef *peVar3;
  
  if (((n->prsnnlf == 0) && ((n->prsnv).prsnvt.toktyp == 0x38)) &&
     ((n->prsnv).prsnvt.toksym.tokstyp != '\x04')) {
    prsdef(ctx,&(n->prsnv).prsnvt,8);
    switch((n->prsnv).prsnvt.toksym.tokstyp) {
    case '\x01':
    case '\b':
      emtres(ctx->prscxemt,1);
      peVar3 = ctx->prscxemt;
      uVar2 = peVar3->emtcxofs;
      peVar3->emtcxofs = uVar2 + 1;
      peVar3->emtcxptr[uVar2] = '\x11';
      break;
    default:
      errlogf(ctx->prscxerr,"TADS",0x134);
      break;
    case '\x06':
      emtres(ctx->prscxemt,1);
      peVar3 = ctx->prscxemt;
      uVar2 = peVar3->emtcxofs;
      peVar3->emtcxofs = uVar2 + 1;
      peVar3->emtcxptr[uVar2] = '\x1e';
      break;
    case '\n':
      emtres(ctx->prscxemt,1);
      peVar3 = ctx->prscxemt;
      uVar2 = peVar3->emtcxofs;
      peVar3->emtcxofs = uVar2 + 1;
      peVar3->emtcxptr[uVar2] = 'H';
    }
    emtres(ctx->prscxemt,1);
    peVar3 = ctx->prscxemt;
    uVar2 = peVar3->emtcxofs;
    peVar3->emtcxofs = uVar2 + 1;
    peVar3->emtcxptr[uVar2] = (uchar)cnt;
    emtres(ctx->prscxemt,2);
    *(undefined2 *)(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs) =
         *(undefined2 *)((long)&n->prsnv + 0x42);
    puVar1 = &ctx->prscxemt->emtcxofs;
    *puVar1 = *puVar1 + 2;
  }
  else {
    prsgexp(ctx,n);
    emtres(ctx->prscxemt,1);
    peVar3 = ctx->prscxemt;
    uVar2 = peVar3->emtcxofs;
    peVar3->emtcxofs = uVar2 + 1;
    peVar3->emtcxptr[uVar2] = '&';
    emtres(ctx->prscxemt,1);
    peVar3 = ctx->prscxemt;
    uVar2 = peVar3->emtcxofs;
    peVar3->emtcxofs = uVar2 + 1;
    peVar3->emtcxptr[uVar2] = (uchar)cnt;
  }
  return;
}

Assistant:

static void prsgfn(prscxdef *ctx, prsndef *n, int cnt)
{
    if (n->prsnnlf == 0 && n->prsnv.prsnvt.toktyp == TOKTSYMBOL
        && (n->prsnv.prsnvt.toksym.tokstyp == TOKSTUNK
            || n->prsnv.prsnvt.toksym.tokstyp != TOKSTLOCAL))
    {
        tokdef *t = &n->prsnv.prsnvt;
        
        /* if symbol is undefined, add to symbol table as a new function */
        prsdef(ctx, t, TOKSTFWDFN);
        
        /* non-local-var symbol: interpret as a function */
        switch(t->toksym.tokstyp)
        {
        case TOKSTFUNC:
        case TOKSTFWDFN:
            emtop(ctx->prscxemt, OPCCALL);
            break;
        case TOKSTEXTERN:
            emtop(ctx->prscxemt, OPCCALLEXT);
            break;
        case TOKSTBIFN:
            emtop(ctx->prscxemt, OPCBUILTIN);
            break;
        default:
            errlog(ctx->prscxerr, ERR_REQFCN);
        }
        emtbyte(ctx->prscxemt, cnt);            /* emit argument count byte */
        emtint2(ctx->prscxemt, t->toksym.toksval);
    }
    else
    {
        /* expression - evaluate, and assume it yields a function pointer */
        prsgexp(ctx, n);
        emtop(ctx->prscxemt, OPCPTRCALL);
        emtbyte(ctx->prscxemt, cnt);                 /* argument count byte */
    }
}